

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operation.cpp
# Opt level: O2

void operation::scalarProductT(tensor *res,tensor a,tensor b,int *size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = 0;
  uVar1 = (ulong)(uint)size[2];
  if (size[2] < 1) {
    uVar1 = uVar3;
  }
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    uVar5 = (ulong)(uint)size[1];
    if (size[1] < 1) {
      uVar5 = uVar3;
    }
    for (uVar2 = 0; uVar2 != uVar5; uVar2 = uVar2 + 1) {
      uVar6 = (ulong)(uint)*size;
      if (*size < 1) {
        uVar6 = uVar3;
      }
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        (*res)[uVar7][uVar2][uVar4] = b[uVar7][uVar2][uVar4] * a[uVar7][uVar2][uVar4];
      }
    }
  }
  return;
}

Assistant:

void scalarProductT(type::tensor* res, type::tensor a, type::tensor b, int size[])
    {
        for(int i(0); i < size[2]; i++)
            for(int j(0); j < size[1]; j++)
                for(int k(0); k < size[0]; k++)
                    (*res)[k][j][i] = a[k][j][i] * b[k][j][i];
    }